

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::ConvolutionParameter::ConvolutionParameter(ConvolutionParameter *this)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__ConvolutionParameter_0071d170;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = 0;
  (this->pad_).current_size_ = 0;
  (this->pad_).total_size_ = 0;
  (this->pad_).rep_ = (Rep *)0x0;
  (this->kernel_size_).current_size_ = 0;
  (this->kernel_size_).total_size_ = 0;
  (this->kernel_size_).rep_ = (Rep *)0x0;
  (this->stride_).current_size_ = 0;
  (this->stride_).total_size_ = 0;
  (this->stride_).rep_ = (Rep *)0x0;
  (this->dilation_).current_size_ = 0;
  (this->dilation_).total_size_ = 0;
  (this->dilation_).rep_ = (Rep *)0x0;
  if (this != (ConvolutionParameter *)&_ConvolutionParameter_default_instance_) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  caffe::ConvolutionParameter((caffe *)this);
  return;
}

Assistant:

ConvolutionParameter::ConvolutionParameter()
  : ::google::protobuf::Message(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:caffe.ConvolutionParameter)
}